

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapDate(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *pSVar1;
  RecyclableObject *pRVar2;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag == SnapDateObject) {
    pRVar2 = Js::JavascriptLibrary::CreateDate_TTD
                       ((pSVar1->super_ScriptContextBase).javascriptLibrary,
                        *snpObject->AddtlSnapObjectInfo);
    return pRVar2;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapDate(const SnapObject* snpObject, InflateMap* inflator)
        {
            //Dates are not too common and have some mutable state so it seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            double* dateInfo = SnapObjectGetAddtlInfoAs<double*, SnapObjectType::SnapDateObject>(snpObject);

            return ctx->GetLibrary()->CreateDate_TTD(*dateInfo);
        }